

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int generate_by_miniscript_andor
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  uchar last_op [1];
  uchar second_op [1];
  uchar first_op [1];
  size_t indexes [3];
  
  first_op[0] = 'd';
  second_op[0] = 'g';
  last_op[0] = 'h';
  indexes[0] = 0;
  indexes[1] = 2;
  indexes[2] = 1;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,3,indexes,(uchar *)0x0,0,first_op,1,second_op,1,
                     last_op,1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_andor(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char first_op[] = {OP_NOTIF};
    unsigned char second_op[] = {OP_ELSE};
    unsigned char last_op[] = {OP_ENDIF};
    const size_t indexes[] = {0, 2, 1};
    /* [X] NOTIF 0 ELSE [Y] ENDIF */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        3,
        indexes,
        NULL,
        0,
        first_op,
        sizeof(first_op) / sizeof(unsigned char),
        second_op,
        sizeof(second_op) / sizeof(unsigned char),
        last_op,
        sizeof(last_op) / sizeof(unsigned char),
        script,
        script_len,
        write_len);
}